

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_intlog.cpp
# Opt level: O1

void __thiscall
bitmanip::anon_unknown_0::Test_intlog_log2floor_debruijn_forPow2_::run
          (Test_intlog_log2floor_debruijn_forPow2_ *this)

{
  return;
}

Assistant:

BITMANIP_TEST(intlog, log2floor_debruijn_forPow2)
{
    test_log2_floor_forPow2<log2floor_debruijn>();
}